

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor_test.cpp
# Opt level: O3

void __thiscall preprocessor_test_for_Test::TestBody(preprocessor_test_for_Test *this)

{
  char *message;
  char for_str [43];
  AssertHelper AStack_58;
  Message local_50;
  internal local_48 [8];
  undefined8 *local_40;
  char local_38 [48];
  
  builtin_strncpy(local_38 + 0x20,"4e-yeet5f-",0xb);
  builtin_strncpy(local_38 + 0x10,"et2c-yeet3d-yeet",0x10);
  builtin_strncpy(local_38,"yeet0a-yeet1b-ye",0x10);
  testing::internal::CmpHelperSTREQ
            (local_48,"for_str","\"yeet0a-yeet1b-yeet2c-yeet3d-yeet4e-yeet5f-\"",local_38,
             "yeet0a-yeet1b-yeet2c-yeet3d-yeet4e-yeet5f-");
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message(&local_50);
    if (local_40 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_40;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0xac,message);
    testing::internal::AssertHelper::operator=(&AStack_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if (local_50.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_50.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_40 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_40 != local_40 + 2) {
      operator_delete((undefined8 *)*local_40);
    }
    operator_delete(local_40);
  }
  return;
}

Assistant:

TEST_F(preprocessor_test, for)
{
#define PREPROCESSOR_TEST_FOR(context, iterator, element) \
	context \
		PREPROCESSOR_STRINGIFY(iterator) \
			element \
		"-"

	const char for_str[] = PREPROCESSOR_FOR(PREPROCESSOR_TEST_FOR, "yeet", "a", "b", "c", "d", "e", "f");

#undef PREPROCESSOR_TEST_FOR

	EXPECT_STREQ(for_str, "yeet0a-yeet1b-yeet2c-yeet3d-yeet4e-yeet5f-");
}